

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintsettingsoutput.h
# Opt level: O1

void __thiscall
Ui_QPrintSettingsOutput::retranslateUi(Ui_QPrintSettingsOutput *this,QWidget *QPrintSettingsOutput)

{
  QGroupBox *pQVar1;
  QRadioButton *pQVar2;
  QLabel *pQVar3;
  QLineEdit *pQVar4;
  QCheckBox *pQVar5;
  QWidget *pQVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Form",0);
  QWidget::setWindowTitle((QString *)QPrintSettingsOutput);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = this->gbPrintRange;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Print range",0);
  QGroupBox::setTitle((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->printAll;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Print all",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->printRange;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Pages from",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar3 = this->label_3;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","to",0);
  QLabel::setText((QString *)pQVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->pagesRadioButton;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Pages",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar4 = this->pagesLineEdit;
  QCoreApplication::translate
            ((char *)local_40,"QPrintSettingsOutput",
             "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9."
             ,0);
  QWidget::setToolTip((QString *)pQVar4);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->printCurrentPage;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Current Page",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->printSelection;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Selection",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar3 = this->pageSetLabel;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Page Set:",0);
  QLabel::setText((QString *)pQVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = this->groupBox;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Output Settings",0);
  QGroupBox::setTitle((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar3 = this->label;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Copies:",0);
  QLabel::setText((QString *)pQVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar5 = this->collate;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Collate",0);
  QAbstractButton::setText((QString *)pQVar5);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar5 = this->reverse;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Reverse",0);
  QAbstractButton::setText((QString *)pQVar5);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar6 = (QWidget *)this->tabs;
  uVar7 = QTabWidget::indexOf(pQVar6);
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Copies",0);
  QTabWidget::setTabText((int)pQVar6,(QString *)(ulong)uVar7);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = this->colorMode;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Color Mode",0);
  QGroupBox::setTitle((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->color;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Color",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->grayscale;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Grayscale",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = this->duplex;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Double Sided Printing",0);
  QGroupBox::setTitle((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->noDuplex;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Off",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->duplexLong;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Long side binding",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->duplexShort;
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Short side binding",0);
  QAbstractButton::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar6 = (QWidget *)this->tabs;
  uVar7 = QTabWidget::indexOf(pQVar6);
  QCoreApplication::translate((char *)local_40,"QPrintSettingsOutput","Options",0);
  QTabWidget::setTabText((int)pQVar6,(QString *)(ulong)uVar7);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintSettingsOutput)
    {
        QPrintSettingsOutput->setWindowTitle(QCoreApplication::translate("QPrintSettingsOutput", "Form", nullptr));
        gbPrintRange->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Print range", nullptr));
        printAll->setText(QCoreApplication::translate("QPrintSettingsOutput", "Print all", nullptr));
        printRange->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages from", nullptr));
        label_3->setText(QCoreApplication::translate("QPrintSettingsOutput", "to", nullptr));
        pagesRadioButton->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages", nullptr));
#if QT_CONFIG(tooltip)
        pagesLineEdit->setToolTip(QCoreApplication::translate("QPrintSettingsOutput", "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9.", nullptr));
#endif // QT_CONFIG(tooltip)
        printCurrentPage->setText(QCoreApplication::translate("QPrintSettingsOutput", "Current Page", nullptr));
        printSelection->setText(QCoreApplication::translate("QPrintSettingsOutput", "Selection", nullptr));
        pageSetLabel->setText(QCoreApplication::translate("QPrintSettingsOutput", "Page Set:", nullptr));
        groupBox->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Output Settings", nullptr));
        label->setText(QCoreApplication::translate("QPrintSettingsOutput", "Copies:", nullptr));
        collate->setText(QCoreApplication::translate("QPrintSettingsOutput", "Collate", nullptr));
        reverse->setText(QCoreApplication::translate("QPrintSettingsOutput", "Reverse", nullptr));
        tabs->setTabText(tabs->indexOf(copiesTab), QCoreApplication::translate("QPrintSettingsOutput", "Copies", nullptr));
        colorMode->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Color Mode", nullptr));
        color->setText(QCoreApplication::translate("QPrintSettingsOutput", "Color", nullptr));
        grayscale->setText(QCoreApplication::translate("QPrintSettingsOutput", "Grayscale", nullptr));
        duplex->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Double Sided Printing", nullptr));
        noDuplex->setText(QCoreApplication::translate("QPrintSettingsOutput", "Off", nullptr));
        duplexLong->setText(QCoreApplication::translate("QPrintSettingsOutput", "Long side binding", nullptr));
        duplexShort->setText(QCoreApplication::translate("QPrintSettingsOutput", "Short side binding", nullptr));
        tabs->setTabText(tabs->indexOf(optionsTab), QCoreApplication::translate("QPrintSettingsOutput", "Options", nullptr));
    }